

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggwave.cpp
# Opt level: O1

int __thiscall GGWave::maxBytesPerTx(GGWave *this,Protocols *protocols)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  iVar1 = 1;
  lVar3 = 0xd;
  do {
    iVar2 = (int)*(char *)((long)protocols->data + lVar3 + -2);
    if (iVar2 < iVar1) {
      iVar2 = iVar1;
    }
    if (*(char *)((long)&protocols->data[0].name + lVar3) == '\0') {
      iVar2 = iVar1;
    }
    iVar1 = iVar2;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x16d);
  return iVar1;
}

Assistant:

int GGWave::maxBytesPerTx(const Protocols & protocols) const {
    int res = 1;
    for (int i = 0; i < protocols.size(); ++i) {
        const auto & protocol = protocols[i];
        if (protocol.enabled == false) {
            continue;
        }
        res = GG_MAX(res, (int) protocol.bytesPerTx);
    }
    return res;
}